

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

CppTypeName * capnp::anon_unknown_1::CppTypeName::makePrimitive(StringPtr name)

{
  StringPtr *in_RDX;
  CppTypeName *in_RDI;
  kj local_58 [16];
  StringTree local_48;
  
  kj::strTree<kj::StringPtr&>(&local_48,local_58,in_RDX);
  CppTypeName(in_RDI,&local_48,false);
  kj::StringTree::~StringTree(&local_48);
  return in_RDI;
}

Assistant:

static CppTypeName makePrimitive(kj::StringPtr name) {
    return CppTypeName(kj::strTree(name), false);
  }